

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

bool __thiscall
duckdb::RangeInfoStruct<duckdb::NumericRangeInfo,_true>::RowIsValid
          (RangeInfoStruct<duckdb::NumericRangeInfo,_true> *this,idx_t row_idx)

{
  long lVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  long lVar4;
  ValidityMask *pVVar5;
  ulong uVar6;
  idx_t iVar7;
  bool bVar8;
  
  lVar4 = (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
  bVar8 = lVar4 == 0;
  if (!bVar8) {
    lVar4 = lVar4 >> 3;
    uVar3 = lVar4 * 0x4ec4ec4ec4ec4ec5;
    pVVar5 = &this->vdata[0].validity;
    uVar6 = 1;
    do {
      iVar7 = row_idx;
      if (**(long **)((long)(pVVar5 + -1) + 0x10) != 0) {
        iVar7 = (idx_t)*(uint *)(**(long **)((long)(pVVar5 + -1) + 0x10) + row_idx * 4);
      }
      puVar2 = (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar2 != (unsigned_long *)0x0) && ((puVar2[iVar7 >> 6] >> (iVar7 & 0x3f) & 1) == 0)) {
        return bVar8;
      }
      bVar8 = uVar3 <= uVar6;
      lVar1 = (lVar4 * -0x4ec4ec4ec4ec4ec5 - (ulong)(uVar3 == 0)) + uVar6;
      uVar6 = uVar6 + 1;
      pVVar5 = (ValidityMask *)((long)(pVVar5 + 2) + 8);
    } while (lVar1 != 0);
  }
  return bVar8;
}

Assistant:

bool RowIsValid(idx_t row_idx) {
		for (idx_t i = 0; i < args.ColumnCount(); i++) {
			auto idx = vdata[i].sel->get_index(row_idx);
			if (!vdata[i].validity.RowIsValid(idx)) {
				return false;
			}
		}
		return true;
	}